

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O3

LIBSSH2_KNOWNHOSTS * libssh2_knownhost_init(LIBSSH2_SESSION *session)

{
  LIBSSH2_KNOWNHOSTS *pLVar1;
  
  pLVar1 = (LIBSSH2_KNOWNHOSTS *)(*session->alloc)(0x18,&session->abstract);
  if (pLVar1 == (LIBSSH2_KNOWNHOSTS *)0x0) {
    _libssh2_error(session,-6,"Unable to allocate memory for known-hosts collection");
  }
  else {
    pLVar1->session = session;
    _libssh2_list_init(&pLVar1->head);
  }
  return pLVar1;
}

Assistant:

LIBSSH2_API LIBSSH2_KNOWNHOSTS *
libssh2_knownhost_init(LIBSSH2_SESSION *session)
{
    LIBSSH2_KNOWNHOSTS *knh =
        LIBSSH2_ALLOC(session, sizeof(struct _LIBSSH2_KNOWNHOSTS));

    if(!knh) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to allocate memory for known-hosts "
                       "collection");
        return NULL;
    }

    knh->session = session;

    _libssh2_list_init(&knh->head);

    return knh;
}